

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles2::Functional::evalSequenceSideEffCase0(ShaderEvalContext *ctx)

{
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  Vector<float,_4> local_30;
  undefined8 local_20;
  undefined8 local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *ctx_local;
  
  local_10 = ctx;
  tcu::Vector<float,_4>::swizzle(&local_30,(int)ctx + 0x30,1,2,3);
  tcu::Vector<float,_4>::swizzle(&local_40,(int)local_10 + 0x40,3,2,1);
  tcu::Vector<float,_4>::swizzle(&local_50,(int)local_10 + 0x50,0,3,2);
  sequenceSideEffCase0((Functional *)&local_20,&local_30,&local_40,&local_50);
  *(undefined8 *)(local_10->color).m_data = local_20;
  *(undefined8 *)((local_10->color).m_data + 2) = local_18;
  return;
}

Assistant:

void evalSequenceSideEffCase0	(ShaderEvalContext& ctx) { ctx.color		= sequenceSideEffCase0(ctx.in[0].swizzle(1, 2, 3, 0), ctx.in[1].swizzle(3, 2, 1, 0), ctx.in[2].swizzle(0, 3, 2, 1)); }